

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void check_boundary(Terminal *term,wchar_t x,wchar_t y)

{
  termchar *ptVar1;
  undefined8 uVar2;
  unsigned_long uVar3;
  termline *line;
  wchar_t col;
  
  if ((L'\0' < x) && (x <= term->cols)) {
    line = lineptr(term,y,L'૑',L'\x01');
    check_trust_status(term,line);
    check_line_size(term,line);
    if (term->cols == x) {
      *(byte *)&line->lattr = (byte)line->lattr & 0xdf;
    }
    else if (line->chars[(uint)x].chr == 0xdfff) {
      col = x + L'\xffffffff';
      clear_cc(line,col);
      clear_cc(line,x);
      ptVar1 = line->chars;
      ptVar1[(uint)col].chr = 0xd820;
      uVar2 = (&ptVar1[(uint)col].truecolour)[1];
      ptVar1[(uint)x].truecolour = ptVar1[(uint)col].truecolour;
      (&ptVar1[(uint)x].truecolour)[1] = (truecolour)uVar2;
      uVar3 = ptVar1[(uint)col].attr;
      ptVar1[(uint)x].chr = ptVar1[(uint)col].chr;
      ptVar1[(uint)x].attr = uVar3;
    }
  }
  return;
}

Assistant:

static void check_boundary(Terminal *term, int x, int y)
{
    termline *ldata;

    /* Validate input coordinates, just in case. */
    if (x <= 0 || x > term->cols)
        return;

    ldata = scrlineptr(y);
    check_trust_status(term, ldata);
    check_line_size(term, ldata);
    if (x == term->cols) {
        ldata->lattr &= ~LATTR_WRAPPED2;
    } else {
        if (ldata->chars[x].chr == UCSWIDE) {
            clear_cc(ldata, x-1);
            clear_cc(ldata, x);
            ldata->chars[x-1].chr = ' ' | CSET_ASCII;
            ldata->chars[x] = ldata->chars[x-1];
        }
    }
}